

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct.cpp
# Opt level: O2

int __thiscall
ncnn::InnerProduct::forward(InnerProduct *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  uint _c;
  uint uVar1;
  size_t sVar2;
  void *pvVar3;
  void *pvVar4;
  float *pfVar5;
  void *pvVar6;
  size_t sVar7;
  uint uVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  int sum;
  int iVar14;
  int iVar15;
  int q;
  ulong uVar16;
  ulong uVar17;
  undefined1 auVar18 [12];
  float fVar19;
  float fVar20;
  undefined1 local_118 [16];
  int *out;
  Mat bottom_blob_int8;
  Mat bottom_blob_tm;
  Option opt_g;
  
  iVar9 = bottom_blob->w;
  iVar14 = bottom_blob->h;
  _c = bottom_blob->c;
  sVar2 = bottom_blob->elemsize;
  Mat::create(top_blob,this->num_output,sVar2,opt->blob_allocator);
  if (top_blob->data == (void *)0x0) {
    return -100;
  }
  if ((long)top_blob->c * top_blob->cstep == 0) {
    return -100;
  }
  uVar8 = iVar14 * iVar9;
  if (this->use_int8_inference == false) {
    uVar17 = 0;
    if (0 < (int)uVar8) {
      uVar17 = (ulong)uVar8;
    }
    uVar12 = 0;
    if (0 < (int)_c) {
      uVar12 = (ulong)_c;
    }
    iVar9 = 0;
    for (lVar13 = 0; lVar13 < this->num_output; lVar13 = lVar13 + 1) {
      if (this->bias_term == 0) {
        auVar18 = ZEXT812(0);
      }
      else {
        auVar18._4_8_ = 0;
        auVar18._0_4_ = *(uint *)((long)(this->bias_data).data + lVar13 * 4);
      }
      local_118._12_4_ = 0;
      local_118._0_12_ = auVar18;
      lVar10 = (long)iVar9 << 2;
      for (uVar16 = 0; uVar16 != uVar12; uVar16 = uVar16 + 1) {
        pvVar3 = (this->weight_data).data;
        Mat::channel(&bottom_blob_tm,bottom_blob,(int)uVar16);
        pvVar6 = bottom_blob_tm.data;
        Mat::~Mat(&bottom_blob_tm);
        for (uVar11 = 0; uVar17 != uVar11; uVar11 = uVar11 + 1) {
          local_118._0_4_ =
               (float)local_118._0_4_ +
               *(float *)((long)pvVar3 + uVar11 * 4 + lVar10) *
               *(float *)((long)pvVar6 + uVar11 * 4);
        }
        lVar10 = lVar10 + (long)(int)uVar8 * 4;
      }
      switch(this->activation_type) {
      case 1:
        if ((float)local_118._0_4_ <= 0.0) {
          local_118._0_4_ = 0.0;
        }
        break;
      case 2:
        local_118._0_4_ =
             (float)local_118._0_4_ *
             (float)(~-(uint)(0.0 < (float)local_118._0_4_) & *(this->activation_params).data |
                    -(uint)(0.0 < (float)local_118._0_4_) & 0x3f800000);
        break;
      case 3:
        pfVar5 = (float *)(this->activation_params).data;
        fVar19 = pfVar5[1];
        fVar20 = *pfVar5;
        if ((float)local_118._0_4_ <= fVar20) {
          local_118._0_4_ = fVar20;
        }
        if (fVar19 < (float)local_118._0_4_) {
          local_118._0_4_ = fVar19;
        }
        break;
      case 4:
        fVar19 = expf(-(float)local_118._0_4_);
        local_118._0_4_ = 1.0 / (fVar19 + 1.0);
      }
      *(undefined4 *)((long)top_blob->data + lVar13 * 4) = local_118._0_4_;
      iVar9 = iVar9 + uVar8 * _c;
    }
    return 0;
  }
  Mat::Mat(&bottom_blob_tm,bottom_blob);
  if (sVar2 != 1) {
    bottom_blob_int8.elemsize._0_4_ = 0;
    bottom_blob_int8.elemsize._4_4_ = 0;
    bottom_blob_int8.elempack = 0;
    bottom_blob_int8.data = (void *)0x0;
    bottom_blob_int8.refcount._0_4_ = 0;
    bottom_blob_int8.refcount._4_4_ = 0;
    bottom_blob_int8.allocator = (Allocator *)0x0;
    bottom_blob_int8.dims = 0;
    bottom_blob_int8.w = 0;
    bottom_blob_int8.h = 0;
    bottom_blob_int8.c = 0;
    bottom_blob_int8.cstep = 0;
    Mat::create(&bottom_blob_int8,iVar9,iVar14,_c,1,opt->workspace_allocator);
    if ((bottom_blob_int8.data == (void *)0x0) ||
       ((long)bottom_blob_int8.c * bottom_blob_int8.cstep == 0)) {
      Mat::~Mat(&bottom_blob_int8);
      iVar15 = -100;
      goto LAB_00134916;
    }
    (*this->quantize->_vptr_Layer[7])(this->quantize,bottom_blob);
    Mat::operator=(&bottom_blob_tm,&bottom_blob_int8);
    Mat::~Mat(&bottom_blob_int8);
  }
  iVar9 = 0;
  uVar17 = 0;
  if (0 < (int)uVar8) {
    uVar17 = (ulong)uVar8;
  }
  uVar12 = 0;
  if (0 < (int)_c) {
    uVar12 = (ulong)_c;
  }
  lVar13 = 0;
  while( true ) {
    uVar1 = this->num_output;
    pvVar3 = top_blob->data;
    if ((int)uVar1 <= lVar13) break;
    lVar10 = (long)iVar9;
    iVar14 = 0;
    for (uVar16 = 0; sVar7 = bottom_blob_tm.cstep, sVar2 = bottom_blob_tm.elemsize,
        pvVar6 = bottom_blob_tm.data, uVar16 != uVar12; uVar16 = uVar16 + 1) {
      pvVar4 = (this->weight_data).data;
      bottom_blob_int8.data =
           (void *)(bottom_blob_tm.cstep * uVar16 * bottom_blob_tm.elemsize +
                   (long)bottom_blob_tm.data);
      bottom_blob_int8.refcount._0_4_ = 0;
      bottom_blob_int8.refcount._4_4_ = 0;
      bottom_blob_int8.elemsize._0_4_ = (undefined4)bottom_blob_tm.elemsize;
      bottom_blob_int8.elemsize._4_4_ = (undefined4)(bottom_blob_tm.elemsize >> 0x20);
      bottom_blob_int8.elempack = bottom_blob_tm.elempack;
      bottom_blob_int8.allocator = bottom_blob_tm.allocator;
      bottom_blob_int8.w = bottom_blob_tm.w;
      bottom_blob_int8.dims = 2;
      bottom_blob_int8.c = 1;
      bottom_blob_int8.h = bottom_blob_tm.h;
      bottom_blob_int8.cstep = (size_t)(bottom_blob_tm.h * bottom_blob_tm.w);
      Mat::~Mat(&bottom_blob_int8);
      for (uVar11 = 0; uVar17 != uVar11; uVar11 = uVar11 + 1) {
        iVar14 = iVar14 + (int)*(char *)((long)pvVar4 + uVar11 + lVar10) *
                          (int)*(char *)((long)pvVar6 + uVar11 + sVar7 * sVar2 * uVar16);
      }
      lVar10 = lVar10 + (int)uVar8;
    }
    *(int *)((long)pvVar3 + lVar13 * 4) = iVar14;
    lVar13 = lVar13 + 1;
    iVar9 = iVar9 + uVar8 * _c;
  }
  pvVar6 = (this->weight_data_int8_scales).data;
  iVar9 = this->bias_term;
  iVar14 = this->activation_type;
  iVar15 = 0;
  uVar17 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar17 = 0;
  }
  pvVar4 = (this->bias_data).data;
  for (uVar12 = 0; uVar17 != uVar12; uVar12 = uVar12 + 1) {
    fVar19 = *(float *)((long)pvVar6 + uVar12 * 4);
    fVar19 = (float)*(int *)((long)pvVar3 + uVar12 * 4) *
             (float)(~-(uint)(fVar19 == 0.0) & (uint)(1.0 / (this->bottom_blob_int8_scale * fVar19))
                    );
    if (iVar9 != 0) {
      fVar19 = fVar19 + *(float *)((long)pvVar4 + uVar12 * 4);
    }
    fVar20 = 0.0;
    if (0.0 <= fVar19) {
      fVar20 = fVar19;
    }
    if (iVar14 != 1) {
      fVar20 = fVar19;
    }
    *(float *)((long)pvVar3 + uVar12 * 4) = fVar20;
  }
LAB_00134916:
  Mat::~Mat(&bottom_blob_tm);
  return iVar15;
}

Assistant:

int InnerProduct::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int size = w * h;

    top_blob.create(num_output, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    if (use_int8_inference)
    {
        Mat bottom_blob_tm = bottom_blob;
        if (elemsize != 1)
        {
            Mat bottom_blob_int8;
            bottom_blob_int8.create(w, h, channels, (size_t)1u, opt.workspace_allocator);
            if (bottom_blob_int8.empty())
                return -100;

            // quantize, scale and round to nearest
            {
                Option opt_g = opt;
                opt_g.blob_allocator = bottom_blob_int8.allocator;

                quantize->forward(bottom_blob, bottom_blob_int8, opt_g);
            }

            bottom_blob_tm = bottom_blob_int8;
        }

        // num_output
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p=0; p<num_output; p++)
        {
            int sum = 0;
            int* out = top_blob;

            // channels
            for (int q=0; q<channels; q++)
            {
                const signed char* w = (const signed char*)weight_data + size * channels * p + size * q;
                const signed char* m = bottom_blob_tm.channel(q);

                for (int i = 0; i < size; i++)
                {
                    sum += m[i] * w[i];
                }
            }

            out[p] = sum;       
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p=0; p<num_output; p++)
        {
            int* out_s32 = top_blob;
            float* out_f32 = top_blob;
            float top_rescale = 1.f;
            if (weight_data_int8_scales[p] == 0)
                top_rescale = 0;
            else
                top_rescale = 1.f / (bottom_blob_int8_scale * weight_data_int8_scales[p]);

            if (bias_term)
                out_f32[p] = out_s32[p] * top_rescale + bias_data[p];
            else
                out_f32[p] = out_s32[p] * top_rescale;

            if (activation_type == 1)
            {
                out_f32[p] = std::max(out_f32[p], 0.f);
            }                
        }

        return 0;
    }

    // num_output
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p=0; p<num_output; p++)
    {
        float sum = 0.f;

        if (bias_term)
            sum = bias_data[p];

        // channels
        for (int q=0; q<channels; q++)
        {
            const float* w = (const float*)weight_data + size * channels * p + size * q;
            const float* m = bottom_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                sum += m[i] * w[i];
            }
        }

        if (activation_type == 1)
        {
            sum = std::max(sum, 0.f);
        }
        else if (activation_type == 2)
        {
            float slope = activation_params[0];
            sum = sum > 0.f ? sum : sum * slope;
        }
        else if (activation_type == 3)
        {
            float min = activation_params[0];
            float max = activation_params[1];
            if (sum < min)
                sum = min;
            if (sum > max)
                sum = max;
        }
        else if (activation_type == 4)
        {
            sum = 1.f / (1.f + exp(-sum));
        }

        top_blob[p] = sum;
    }

    return 0;
}